

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O1

double __thiscall HighsDomain::doChangeBound(HighsDomain *this,HighsDomainChange *boundchg)

{
  HighsInt *__args;
  double dVar1;
  int col;
  pointer pdVar2;
  pointer puVar3;
  iterator __position;
  double oldbound;
  
  __args = &boundchg->column;
  col = boundchg->column;
  if (boundchg->boundtype == kLower) {
    pdVar2 = (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    oldbound = pdVar2[col];
    pdVar2[col] = boundchg->boundval;
    dVar1 = boundchg->boundval;
    if ((oldbound == dVar1) && (!NAN(oldbound) && !NAN(dVar1))) {
      return oldbound;
    }
    if (this->infeasible_ == false) {
      updateActivityLbChange(this,col,oldbound,dVar1);
    }
  }
  else {
    pdVar2 = (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    oldbound = pdVar2[col];
    pdVar2[col] = boundchg->boundval;
    dVar1 = boundchg->boundval;
    if ((oldbound == dVar1) && (!NAN(oldbound) && !NAN(dVar1))) {
      return oldbound;
    }
    if (this->infeasible_ == false) {
      updateActivityUbChange(this,col,oldbound,dVar1);
    }
  }
  puVar3 = (this->changedcolsflags_).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar3[*__args] == '\0') {
    puVar3[*__args] = '\x01';
    __position._M_current =
         (this->changedcols_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->changedcols_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&this->changedcols_,__position,__args);
    }
    else {
      *__position._M_current = *__args;
      (this->changedcols_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  return oldbound;
}

Assistant:

double HighsDomain::doChangeBound(const HighsDomainChange& boundchg) {
  double oldbound;

  if (boundchg.boundtype == HighsBoundType::kLower) {
    oldbound = col_lower_[boundchg.column];
    col_lower_[boundchg.column] = boundchg.boundval;
    if (oldbound != boundchg.boundval) {
      if (!infeasible_)
        updateActivityLbChange(boundchg.column, oldbound, boundchg.boundval);

      if (!changedcolsflags_[boundchg.column]) {
        changedcolsflags_[boundchg.column] = 1;
        changedcols_.push_back(boundchg.column);
      }
    }
  } else {
    oldbound = col_upper_[boundchg.column];
    col_upper_[boundchg.column] = boundchg.boundval;
    if (oldbound != boundchg.boundval) {
      if (!infeasible_)
        updateActivityUbChange(boundchg.column, oldbound, boundchg.boundval);

      if (!changedcolsflags_[boundchg.column]) {
        changedcolsflags_[boundchg.column] = 1;
        changedcols_.push_back(boundchg.column);
      }
    }
  }

  return oldbound;
}